

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O0

int bssl::dtls1_write_app_data
              (SSL *ssl,bool *out_needs_handshake,size_t *out_bytes_written,
              Span<const_unsigned_char> in)

{
  SSL *pSVar1;
  uchar *puVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  uint16_t in_R9W;
  Span<const_unsigned_char> in_00;
  int ret;
  size_t *out_bytes_written_local;
  bool *out_needs_handshake_local;
  SSL *ssl_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  ssl_local = (SSL *)in.data_;
  iVar5 = SSL_in_init(ssl);
  if (iVar5 == 0) {
    *out_needs_handshake = false;
    if (ssl->s3->write_shutdown == ssl_shutdown_none) {
      sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
      if (sVar6 < 0x4001) {
        bVar3 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
        puVar2 = in_local.data_;
        pSVar1 = ssl_local;
        if (bVar3) {
          *out_bytes_written = 0;
          in_local.size_._4_4_ = 1;
        }
        else {
          uVar4 = DTLSWriteEpoch::epoch(&ssl->d1->write_epoch);
          in_00.size_._0_2_ = uVar4;
          in_00.data_ = puVar2;
          in_00.size_._2_6_ = 0;
          in_local.size_._4_4_ =
               dtls1_write_record((bssl *)ssl,(SSL *)0x17,(int)pSVar1,in_00,in_R9W);
          if (0 < in_local.size_._4_4_) {
            sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
            *out_bytes_written = sVar6;
            in_local.size_._4_4_ = 1;
          }
        }
      }
      else {
        ERR_put_error(0x10,0,0x8f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                      ,0xf9);
        in_local.size_._4_4_ = -1;
      }
    }
    else {
      ERR_put_error(0x10,0,0xc2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                    ,0xf3);
      in_local.size_._4_4_ = -1;
    }
    return in_local.size_._4_4_;
  }
  __assert_fail("!SSL_in_init(ssl)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                ,0xef,"int bssl::dtls1_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
               );
}

Assistant:

int dtls1_write_app_data(SSL *ssl, bool *out_needs_handshake,
                         size_t *out_bytes_written, Span<const uint8_t> in) {
  assert(!SSL_in_init(ssl));
  *out_needs_handshake = false;

  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
    return -1;
  }

  // DTLS does not split the input across records.
  if (in.size() > SSL3_RT_MAX_PLAIN_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DTLS_MESSAGE_TOO_BIG);
    return -1;
  }

  if (in.empty()) {
    *out_bytes_written = 0;
    return 1;
  }

  // TODO(crbug.com/381113363): Use the 0-RTT epoch if writing 0-RTT.
  int ret = dtls1_write_record(ssl, SSL3_RT_APPLICATION_DATA, in,
                               ssl->d1->write_epoch.epoch());
  if (ret <= 0) {
    return ret;
  }
  *out_bytes_written = in.size();
  return 1;
}